

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O0

void Gia_ManBmcAddCone(Bmc_Mna_t *p,int iStart,int iStop)

{
  Vec_Int_t *pVVar1;
  Gia_Man_t *pGVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  int iStop_local;
  int iStart_local;
  Bmc_Mna_t *p_local;
  
  Vec_IntClear(p->vNodes);
  Vec_IntClear(p->vInputs);
  Vec_IntClear(p->vOutputs);
  pVVar1 = p->vId2Var;
  iVar3 = Gia_ManObjNum(p->pFrames);
  Vec_IntFillExtra(pVVar1,iVar3,0);
  for (local_24 = iStart; local_24 < iStop; local_24 = local_24 + 1) {
    pGStack_20 = Gia_ManPo(p->pFrames,local_24);
    pGVar4 = Gia_ObjChild0(pGStack_20);
    pGVar5 = Gia_ManConst0(p->pFrames);
    if (pGVar4 != pGVar5) {
      pGVar4 = Gia_ObjFanin0(pGStack_20);
      Gia_ManBmcAddCone_rec(p,pGVar4);
      pVVar1 = p->vOutputs;
      iVar3 = Gia_ObjId(p->pFrames,pGStack_20);
      Vec_IntPush(pVVar1,iVar3);
    }
  }
  local_24 = 0;
  while( true ) {
    iVar3 = Vec_IntSize(p->vNodes);
    bVar6 = false;
    if (local_24 < iVar3) {
      pGVar2 = p->pFrames;
      iVar3 = Vec_IntEntry(p->vNodes,local_24);
      pGStack_20 = Gia_ManObj(pGVar2,iVar3);
      bVar6 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    *(ulong *)pGStack_20 = *(ulong *)pGStack_20 & 0xffffffffbfffffff;
    local_24 = local_24 + 1;
  }
  local_24 = 0;
  while( true ) {
    iVar3 = Vec_IntSize(p->vInputs);
    bVar6 = false;
    if (local_24 < iVar3) {
      pGVar2 = p->pFrames;
      iVar3 = Vec_IntEntry(p->vInputs,local_24);
      pGStack_20 = Gia_ManObj(pGVar2,iVar3);
      bVar6 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    *(ulong *)pGStack_20 = *(ulong *)pGStack_20 & 0xffffffffbfffffff;
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void Gia_ManBmcAddCone( Bmc_Mna_t * p, int iStart, int iStop )
{
    Gia_Obj_t * pObj;
    int i;
    Vec_IntClear( p->vNodes );
    Vec_IntClear( p->vInputs );
    Vec_IntClear( p->vOutputs );
    Vec_IntFillExtra( p->vId2Var, Gia_ManObjNum(p->pFrames), 0 );
    for ( i = iStart; i < iStop; i++ )
    {
        pObj = Gia_ManPo(p->pFrames, i);
        if ( Gia_ObjChild0(pObj) == Gia_ManConst0(p->pFrames) )
            continue;
        Gia_ManBmcAddCone_rec( p, Gia_ObjFanin0(pObj) );
        Vec_IntPush( p->vOutputs, Gia_ObjId(p->pFrames, pObj) );
    }
    // clean attributes and create new variables
    Gia_ManForEachObjVec( p->vNodes, p->pFrames, pObj, i )
        pObj->fMark0 = 0;
    Gia_ManForEachObjVec( p->vInputs, p->pFrames, pObj, i )
        pObj->fMark0 = 0;
}